

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O1

const_iterator * __thiscall
pstore::index::
hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>
::find<std::__cxx11::string,void>
          (const_iterator *__return_storage_ptr__,
          hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>
          *this,database *db,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  ulong uVar1;
  long lVar2;
  undefined8 uVar3;
  const_iterator *pcVar4;
  database *pdVar5;
  bool bVar6;
  int iVar7;
  uint64_t uVar8;
  database_reader *extraout_RDX;
  database_reader *extraout_RDX_00;
  database_reader *archive;
  uint uVar9;
  unsigned_long uVar10;
  internal_node *piVar11;
  index_pointer node;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pair<const_pstore::index::details::index_pointer,_unsigned_long> pVar12;
  key_type existing_key;
  parent_stack parents;
  undefined1 local_168 [40];
  parent_stack *local_140;
  const_iterator *local_138;
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  database *local_120;
  database *local_118;
  index_pointer local_110;
  index_pointer local_108 [26];
  database_reader *local_38;
  
  bVar6 = hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this);
  if (bVar6) {
    memset(&__return_storage_ptr__->visited_parents_,0,0xd8);
    __return_storage_ptr__->db_ = db;
    __return_storage_ptr__->index_ =
         (hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)this;
    (__return_storage_ptr__->pos_)._M_t.
    super___uniq_ptr_impl<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super__Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
    ._M_head_impl =
         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)0x0;
  }
  else {
    local_128 = key;
    uVar8 = anon_unknown.dwarf_18e2c8::hash_function::operator()((hash_function *)(this + 0x28),key)
    ;
    node = *(index_pointer *)(this + 0x18);
    local_130 = (hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this;
    memset(local_108,0,0xd8);
    local_140 = &__return_storage_ptr__->visited_parents_;
    uVar9 = 0;
    archive = extraout_RDX;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_138 = __return_storage_ptr__;
    local_120 = db;
    do {
      pdVar5 = local_120;
      if (((ulong)node.internal_ & 1) == 0) {
        if (((ulong)node.internal_ & 2) != 0) {
          __assert_fail("is_address ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map_types.hpp"
                        ,0xe3,"address pstore::index::details::index_pointer::to_address() const");
        }
        local_118 = local_120;
        local_110 = node;
        serialize::read<std::__cxx11::string,pstore::serialize::archive::database_reader>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                   (serialize *)&local_118,archive);
        pcVar4 = local_138;
        if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ ==
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128->_M_string_length) &&
           (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ ==
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 ||
            (iVar7 = bcmp((void *)local_168._0_8_,(local_128->_M_dataplus)._M_p,local_168._8_8_),
            iVar7 == 0)))) {
          if ((database_reader *)0xc < local_38) {
            assert_failed("elements_ < Size",
                          "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/array_stack.hpp"
                          ,100);
          }
          local_108[(long)local_38 * 2] = node;
          lVar2 = (long)local_38 * 2;
          local_38 = (database_reader *)((long)&local_38->db_ + 1);
          local_108[lVar2 + 1] = (index_pointer)0xffffffffffffffff;
          pcVar4->db_ = pdVar5;
          memcpy(local_140,local_108,0xd8);
        }
        else {
          memset(local_140,0,0xd8);
          pcVar4->db_ = pdVar5;
        }
        pcVar4->index_ = local_130;
        (pcVar4->pos_)._M_t.
        super___uniq_ptr_impl<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        .
        super__Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
        ._M_head_impl =
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x0;
        this_01 = this_00;
        if ((element_type *)local_168._0_8_ != (element_type *)(local_168 + 0x10)) {
          operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
        }
        break;
      }
      if (uVar9 < 0x42) {
        details::internal_node::get_node
                  ((pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
                    *)local_168,local_120,node);
        this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_;
        local_168._0_8_ = (element_type *)0x0;
        local_168._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        uVar3 = local_168._16_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
        }
        uVar1 = *(uint64_t *)(uVar3 + 8);
        if ((uVar1 >> (uVar8 & 0x3f) & 1) == 0) {
          pVar12 = (pair<const_pstore::index::details::index_pointer,_unsigned_long>)
                   (ZEXT816(0xffffffffffffffff) << 0x40);
        }
        else {
          uVar10 = POPCOUNT(uVar1 & (1L << ((byte)uVar8 & 0x3f)) - 1U);
          pVar12.second = uVar10;
          pVar12.first.internal_ = ((index_pointer *)(uVar3 + 0x10))[uVar10].internal_;
        }
      }
      else {
        details::linear_node::get_node
                  ((pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
                    *)local_168,local_120,node);
        this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_;
        local_168._0_8_ = (element_type *)0x0;
        local_168._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        uVar3 = local_168._16_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
        }
        pVar12 = details::linear_node::
                 lookup<std::__cxx11::string,std::__cxx11::string,std::equal_to<std::__cxx11::string>,void>
                           ((linear_node *)uVar3,pdVar5,local_128);
      }
      piVar11 = (internal_node *)pVar12.second;
      if (piVar11 == (internal_node *)0xffffffffffffffff) {
        memset(local_140,0,0xd8);
        local_138->db_ = local_120;
        local_138->index_ = local_130;
        (local_138->pos_)._M_t.
        super___uniq_ptr_impl<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        .
        super__Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
        ._M_head_impl =
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x0;
        archive = extraout_RDX_00;
      }
      else {
        if ((database_reader *)0xc < local_38) {
          assert_failed("elements_ < Size",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/array_stack.hpp"
                        ,100);
        }
        archive = (database_reader *)((long)&local_38->db_ + 1);
        local_108[(long)local_38 * 2] = node;
        lVar2 = (long)local_38 * 2;
        local_38 = archive;
        local_108[lVar2 + 1].internal_ = piVar11;
        uVar9 = uVar9 + 6;
        uVar8 = uVar8 >> 6;
        node = pVar12.first;
      }
      this_00 = this_01;
    } while (piVar11 != (internal_node *)0xffffffffffffffff);
    __return_storage_ptr__ = local_138;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      __return_storage_ptr__ = local_138;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

auto hamt_map<KeyType, ValueType, Hash, KeyEqual>::find (database const & db,
                                                                 OtherKeyType const & key) const
            -> const_iterator {
            if (empty ()) {
                return this->cend (db);
            }

            auto hash = static_cast<hash_type> (hash_ (key));
            unsigned bit_shifts = 0;
            index_pointer node = root_;
            parent_stack parents;

            std::shared_ptr<void const> store_node;
            while (!node.is_leaf ()) {
                index_pointer child_node;
                auto index = std::size_t{0};

                if (details::depth_is_internal_node (bit_shifts)) {
                    // It's an internal node.
                    internal_node const * internal = nullptr;
                    std::tie (store_node, internal) = internal_node::get_node (db, node);
                    std::tie (child_node, index) =
                        internal->lookup (hash & details::hash_index_mask);
                } else {
                    // It's a linear node.
                    linear_node const * linear = nullptr;
                    std::tie (store_node, linear) = linear_node::get_node (db, node);
                    std::tie (child_node, index) = linear->lookup<KeyType> (db, key, equal_);
                }

                if (index == details::not_found) {
                    return this->cend (db);
                }
                parents.push (details::parent_type{node, index});

                // Go to next sub-trie level
                node = child_node;
                bit_shifts += details::hash_index_bits;
                hash >>= details::hash_index_bits;
            }
            // It's a leaf node.
            PSTORE_ASSERT (node.is_leaf ());
            key_type const existing_key = get_key (db, node.to_address ());
            if (equal_ (existing_key, key)) {
                parents.push (details::parent_type{node});
                return const_iterator (db, std::move (parents), this);
            }
            return this->cend (db);
        }